

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_pre_g_table(secp256k1_ge_storage *pre_g,size_t n)

{
  undefined1 *puVar1;
  int *piVar2;
  byte bVar3;
  int iVar4;
  undefined4 extraout_EAX;
  uint32_t uVar5;
  secp256k1_scratch_space *scratch;
  code *pcVar6;
  byte bVar7;
  long lVar8;
  uint extraout_EDX;
  uint count;
  ulong uVar9;
  long extraout_RDX;
  secp256k1_ge *scratch_00;
  size_t sVar10;
  secp256k1_gej *r;
  uint uVar11;
  secp256k1_ge *psVar12;
  uint uVar13;
  secp256k1_fe *unaff_RBP;
  secp256k1_strauss_point_state *psVar14;
  uchar *out32;
  secp256k1_sha256 *psVar15;
  ulong uVar16;
  secp256k1_ge *psVar17;
  secp256k1_gej *psVar18;
  ulong uVar19;
  ulong uVar20;
  secp256k1_ge *psVar21;
  secp256k1_gej *psVar22;
  secp256k1_gej *psVar23;
  ulong uVar24;
  code *cb;
  secp256k1_ge *unaff_R12;
  secp256k1_ge *psVar25;
  secp256k1_callback *error_callback;
  secp256k1_sha256 *hash;
  uint uVar26;
  secp256k1_ge *unaff_R13;
  secp256k1_ge *unaff_R14;
  secp256k1_scalar *psVar27;
  secp256k1_ge *unaff_R15;
  secp256k1_ge *a;
  secp256k1_sha256 *psVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  secp256k1_ge gg;
  secp256k1_ge p;
  secp256k1_ge q;
  secp256k1_gej g2;
  ulong uStack_2738;
  secp256k1_strauss_state sStack_2730;
  secp256k1_strauss_point_state sStack_2718;
  secp256k1_fe asStack_2308 [8];
  secp256k1_ge asStack_2188 [8];
  secp256k1_gej *psStack_1e40;
  secp256k1_callback *psStack_1e38;
  secp256k1_ge *psStack_1e28;
  secp256k1_strauss_point_state *psStack_1e20;
  secp256k1_scalar *psStack_1e18;
  undefined1 auStack_1e00 [8];
  undefined1 auStack_1df8 [176];
  secp256k1_gej sStack_1d48;
  secp256k1_gej sStack_1cb0;
  secp256k1_gej sStack_1c18;
  secp256k1_gej sStack_1b80;
  secp256k1_gej sStack_1ae8;
  secp256k1_gej asStack_1a50 [2];
  secp256k1_gej asStack_18d0 [5];
  secp256k1_strauss_point_state sStack_1590;
  secp256k1_scratch_space *psStack_1178;
  secp256k1_sha256 *psStack_1170;
  undefined1 *puStack_1168;
  secp256k1_gej *psStack_1160;
  secp256k1_gej *psStack_1158;
  code *pcStack_1150;
  undefined4 uStack_113e;
  undefined2 uStack_113a;
  secp256k1_gej *psStack_1138;
  long lStack_1130;
  undefined1 auStack_1128 [40];
  undefined8 uStack_1100;
  uint64_t uStack_10f8;
  uint64_t uStack_10f0;
  secp256k1_sha256 sStack_10e8;
  secp256k1_sha256 sStack_1078;
  secp256k1_gej *psStack_1010;
  secp256k1_ge *psStack_1008;
  secp256k1_ge *psStack_1000;
  secp256k1_ge *psStack_ff8;
  secp256k1_gej *psStack_ff0;
  secp256k1_strauss_point_state *psStack_fe8;
  undefined1 auStack_fe0 [32];
  undefined1 auStack_fc0 [40];
  secp256k1_ge *psStack_f98;
  secp256k1_strauss_point_state *psStack_f90;
  secp256k1_gej sStack_f88;
  secp256k1_gej sStack_ef0;
  secp256k1_gej sStack_e58;
  secp256k1_ge sStack_dc0;
  secp256k1_gej sStack_d58;
  secp256k1_ge asStack_cc0 [3];
  secp256k1_ge asStack_b40 [8];
  secp256k1_strauss_point_state sStack_800;
  secp256k1_ge *psStack_3e8;
  secp256k1_ge *psStack_3e0;
  secp256k1_ge *psStack_3d8;
  ulong uStack_3d0;
  secp256k1_ge *psStack_3c8;
  code *pcStack_3c0;
  code *pcStack_3b8;
  uint uStack_3a4;
  int iStack_3a0;
  int iStack_39c;
  secp256k1_ge *psStack_398;
  ulong uStack_390;
  secp256k1_ge *psStack_388;
  secp256k1_ge *psStack_380;
  secp256k1_ge *psStack_378;
  secp256k1_ge *psStack_370;
  secp256k1_ge *psStack_368;
  secp256k1_fe *psStack_360;
  uint local_34c;
  undefined1 local_348 [56];
  ulong uStack_310;
  ulong local_308;
  ulong uStack_300;
  ulong local_2f8;
  ulong local_2f0;
  secp256k1_fe local_2e8;
  secp256k1_ge *local_2b0;
  secp256k1_ge local_2a8;
  uint64_t uStack_240;
  uint64_t local_238;
  uint64_t uStack_230;
  uint64_t local_228;
  uint64_t uStack_220;
  undefined1 local_218 [56];
  uint64_t uStack_1e0;
  uint64_t local_1d8;
  uint64_t uStack_1d0;
  secp256k1_ge *local_1c8;
  uint local_1c0;
  secp256k1_ge local_1a8;
  secp256k1_ge local_138;
  secp256k1_gej local_c8;
  
  bVar3 = 0;
  psVar12 = &local_1a8;
  psStack_360 = (secp256k1_fe *)0x14dcf7;
  local_2a8.y.n[1] = (uint64_t)pre_g;
  secp256k1_ge_from_storage(psVar12,pre_g);
  psStack_360 = (secp256k1_fe *)0x14dcff;
  psVar21 = psVar12;
  iVar4 = secp256k1_ge_is_valid_var(psVar12);
  psVar25 = unaff_R12;
  if (iVar4 != 0) {
    psStack_360 = (secp256k1_fe *)0x14dd36;
    secp256k1_gej_set_ge(&local_c8,&local_1a8);
    psStack_360 = (secp256k1_fe *)0x14dd43;
    secp256k1_gej_double_var(&local_c8,&local_c8,(secp256k1_fe *)0x0);
    psStack_360 = (secp256k1_fe *)0x14dd53;
    secp256k1_ge_set_gej_var((secp256k1_ge *)local_218,&local_c8);
    psVar12 = (secp256k1_ge *)0x40;
    local_34c = local_218._40_4_;
    while( true ) {
      uVar11 = local_34c;
      psVar17 = (secp256k1_ge *)(ulong)local_34c;
      a = (secp256k1_ge *)0x3fffffffffffc;
      unaff_RBP = (secp256k1_fe *)0xffffffffffff;
      psStack_360 = (secp256k1_fe *)0x14dd71;
      secp256k1_fe_verify(&local_1a8.x);
      pre_g = (secp256k1_ge_storage *)0x1;
      psStack_360 = (secp256k1_fe *)0x14dd7e;
      secp256k1_fe_verify_magnitude(&local_1a8.x,1);
      local_348._48_8_ = 0x3ffffbfffff0bc - local_1a8.x.n[0];
      uStack_310 = 0x3ffffffffffffc - local_1a8.x.n[1];
      local_308 = 0x3ffffffffffffc - local_1a8.x.n[2];
      uStack_300 = 0x3ffffffffffffc - local_1a8.x.n[3];
      local_2f8 = 0x3fffffffffffc - local_1a8.x.n[4];
      local_2f0._0_4_ = 2;
      local_2f0._4_4_ = 0;
      unaff_R13 = (secp256k1_ge *)(local_348 + 0x30);
      psStack_360 = (secp256k1_fe *)0x14ddd2;
      secp256k1_fe_verify((secp256k1_fe *)unaff_R13);
      psStack_360 = (secp256k1_fe *)0x14ddda;
      secp256k1_fe_verify((secp256k1_fe *)unaff_R13);
      psVar21 = (secp256k1_ge *)local_218;
      psStack_360 = (secp256k1_fe *)0x14dde7;
      secp256k1_fe_verify((secp256k1_fe *)psVar21);
      if (0x20 < (int)((int)local_2f0 + uVar11)) break;
      local_238 = local_218._0_8_;
      uStack_230 = local_218._8_8_;
      local_348._48_8_ = local_348._48_8_ + local_218._0_8_;
      uStack_310 = uStack_310 + local_218._8_8_;
      local_228 = local_218._16_8_;
      uStack_220 = local_218._24_8_;
      local_308 = local_308 + local_218._16_8_;
      uStack_300 = uStack_300 + local_218._24_8_;
      local_2a8.y.n[3] = local_218._32_8_;
      local_2f8 = local_2f8 + local_218._32_8_;
      local_2f0 = (ulong)((int)local_2f0 + uVar11);
      psStack_360 = (secp256k1_fe *)0x14de6c;
      local_2b0 = psVar12;
      secp256k1_fe_verify((secp256k1_fe *)unaff_R13);
      psStack_360 = (secp256k1_fe *)0x14de74;
      secp256k1_fe_verify((secp256k1_fe *)unaff_R13);
      local_348._48_8_ = (local_2f8 >> 0x30) * 0x1000003d1 + local_348._48_8_;
      uStack_310 = ((ulong)local_348._48_8_ >> 0x34) + uStack_310;
      local_308 = (uStack_310 >> 0x34) + local_308;
      uVar19 = (local_308 >> 0x34) + uStack_300;
      psVar25 = (secp256k1_ge *)0xfffffffffffff;
      uStack_300 = uVar19 & 0xfffffffffffff;
      local_2f8 = (uVar19 >> 0x34) + (local_2f8 & 0xffffffffffff);
      local_308 = local_308 & 0xfffffffffffff;
      uStack_310 = uStack_310 & 0xfffffffffffff;
      local_348._48_8_ = local_348._48_8_ & 0xfffffffffffff;
      local_2f0 = CONCAT44(local_2f0._4_4_,1);
      psStack_360 = (secp256k1_fe *)0x14df03;
      secp256k1_fe_verify((secp256k1_fe *)unaff_R13);
      psStack_360 = (secp256k1_fe *)0x14df13;
      secp256k1_fe_verify(&local_1a8.y);
      pre_g = (secp256k1_ge_storage *)0x1;
      psStack_360 = (secp256k1_fe *)0x14df20;
      secp256k1_fe_verify_magnitude(&local_1a8.y,1);
      local_348._0_8_ = 0x3ffffbfffff0bc - local_1a8.y.n[0];
      local_348._8_8_ = 0x3ffffffffffffc - local_1a8.y.n[1];
      local_348._16_8_ = 0x3ffffffffffffc - local_1a8.y.n[2];
      local_348._24_8_ = 0x3ffffffffffffc - local_1a8.y.n[3];
      local_348._32_8_ = 0x3fffffffffffc - local_1a8.y.n[4];
      local_348._40_4_ = 2;
      local_348._44_4_ = 0;
      psVar17 = (secp256k1_ge *)local_348;
      psStack_360 = (secp256k1_fe *)0x14df74;
      secp256k1_fe_verify((secp256k1_fe *)psVar17);
      psStack_360 = (secp256k1_fe *)0x14df7c;
      secp256k1_fe_verify((secp256k1_fe *)psVar17);
      psVar21 = (secp256k1_ge *)(local_218 + 0x30);
      psStack_360 = (secp256k1_fe *)0x14df89;
      secp256k1_fe_verify((secp256k1_fe *)psVar21);
      uVar11 = local_1c0;
      psVar12 = (secp256k1_ge *)(ulong)local_1c0;
      if (0x20 < (int)(local_348._40_4_ + local_1c0)) goto LAB_0014e686;
      local_2a8.y.n[4] = local_218._48_8_;
      local_2a8.y.magnitude = (undefined4)uStack_1e0;
      local_2a8.y.normalized = uStack_1e0._4_4_;
      local_348._0_8_ = local_348._0_8_ + local_218._48_8_;
      local_348._8_8_ = local_348._8_8_ + uStack_1e0;
      local_2a8._96_8_ = local_1d8;
      uStack_240 = uStack_1d0;
      local_348._16_8_ = local_348._16_8_ + local_1d8;
      local_348._24_8_ = local_348._24_8_ + uStack_1d0;
      local_2a8.y.n[2] = (uint64_t)local_1c8;
      local_348._32_8_ = (long)(local_1c8->x).n + local_348._32_8_;
      local_348._44_4_ = 0;
      local_348._40_4_ = local_348._40_4_ + local_1c0;
      psStack_360 = (secp256k1_fe *)0x14e00c;
      secp256k1_fe_verify((secp256k1_fe *)psVar17);
      psStack_360 = (secp256k1_fe *)0x14e014;
      secp256k1_fe_verify((secp256k1_fe *)psVar17);
      a = (secp256k1_ge *)0x1000003d1;
      local_348._0_8_ = ((ulong)local_348._32_8_ >> 0x30) * 0x1000003d1 + local_348._0_8_;
      local_348._8_8_ = ((ulong)local_348._0_8_ >> 0x34) + local_348._8_8_;
      local_348._16_8_ = ((ulong)local_348._8_8_ >> 0x34) + local_348._16_8_;
      uVar19 = ((ulong)local_348._16_8_ >> 0x34) + local_348._24_8_;
      local_348._24_8_ = uVar19 & 0xfffffffffffff;
      local_348._32_8_ = (uVar19 >> 0x34) + (local_348._32_8_ & 0xffffffffffff);
      local_348._16_8_ = local_348._16_8_ & 0xfffffffffffff;
      local_348._8_8_ = local_348._8_8_ & 0xfffffffffffff;
      local_348._0_8_ = local_348._0_8_ & 0xfffffffffffff;
      local_348._40_4_ = 1;
      psStack_360 = (secp256k1_fe *)0x14e099;
      secp256k1_fe_verify((secp256k1_fe *)psVar17);
      psStack_360 = (secp256k1_fe *)0x14e0a1;
      secp256k1_fe_verify((secp256k1_fe *)unaff_R13);
      uVar19 = (local_2f8 >> 0x30) * 0x1000003d1 + local_348._48_8_;
      unaff_R12 = (secp256k1_ge *)0xffffefffffc2f;
      unaff_R13 = unaff_R12;
      if (((uVar19 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar19 & 0xfffffffffffff) == 0)) {
        uVar9 = (uVar19 >> 0x34) + uStack_310;
        uVar16 = (uVar9 >> 0x34) + local_308;
        uVar20 = (uVar16 >> 0x34) + uStack_300;
        uVar24 = (uVar20 >> 0x34) + (local_2f8 & 0xffffffffffff);
        if ((((uVar9 | uVar19 | uVar16 | uVar20) & 0xfffffffffffff) != 0 || uVar24 != 0) &&
           ((uVar19 + 0x1000003d0 & uVar9 & uVar16 & uVar20 & (uVar24 ^ 0xf000000000000)) !=
            0xfffffffffffff)) goto LAB_0014e22b;
        psStack_360 = (secp256k1_fe *)0x14e169;
        secp256k1_fe_verify((secp256k1_fe *)local_348);
        uVar19 = ((ulong)local_348._32_8_ >> 0x30) * 0x1000003d1 + local_348._0_8_;
        if (((uVar19 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar19 & 0xfffffffffffff) != 0))
        goto LAB_0014e22b;
        uVar9 = (uVar19 >> 0x34) + local_348._8_8_;
        pre_g = (secp256k1_ge_storage *)((uVar9 >> 0x34) + local_348._16_8_);
        psVar21 = (secp256k1_ge *)(((ulong)pre_g >> 0x34) + local_348._24_8_);
        uVar16 = ((ulong)psVar21 >> 0x34) + (local_348._32_8_ & 0xffffffffffff);
        unaff_R14 = psVar17;
        unaff_R15 = a;
        if ((((uVar9 | uVar19 | (ulong)pre_g | (ulong)psVar21) & 0xfffffffffffff) != 0 ||
             uVar16 != 0) &&
           ((uVar19 + 0x1000003d0 & uVar9 & (ulong)pre_g & (ulong)psVar21 &
            (uVar16 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_0014e22b;
        goto LAB_0014e6a4;
      }
LAB_0014e22b:
      pre_g = (secp256k1_ge_storage *)
              ((long)((secp256k1_fe_storage *)local_2a8.y.n[1])->n + (long)(local_2b0->x).n);
      psVar25 = &local_138;
      psStack_360 = (secp256k1_fe *)0x14e24f;
      secp256k1_ge_from_storage(psVar25,pre_g);
      psStack_360 = (secp256k1_fe *)0x14e257;
      psVar21 = psVar25;
      iVar4 = secp256k1_ge_is_valid_var(psVar25);
      if (iVar4 == 0) goto LAB_0014e68b;
      psStack_360 = (secp256k1_fe *)0x14e267;
      secp256k1_fe_verify(&psVar25->x);
      pre_g = (secp256k1_ge_storage *)0x1;
      psStack_360 = (secp256k1_fe *)0x14e274;
      secp256k1_fe_verify_magnitude(&psVar25->x,1);
      local_2e8.n[0] = 0x3ffffbfffff0bc - local_138.x.n[0];
      local_2e8.n[1] = 0x3ffffffffffffc - local_138.x.n[1];
      local_2e8.n[2] = 0x3ffffffffffffc - local_138.x.n[2];
      local_2e8.n[3] = 0x3ffffffffffffc - local_138.x.n[3];
      local_2e8.n[4] = 0x3fffffffffffc - local_138.x.n[4];
      local_2e8.magnitude = 2;
      local_2e8.normalized = 0;
      unaff_RBP = &local_2e8;
      psStack_360 = (secp256k1_fe *)0x14e2d8;
      secp256k1_fe_verify(unaff_RBP);
      psStack_360 = (secp256k1_fe *)0x14e2e0;
      secp256k1_fe_verify(unaff_RBP);
      psVar21 = (secp256k1_ge *)local_218;
      psStack_360 = (secp256k1_fe *)0x14e2ed;
      secp256k1_fe_verify((secp256k1_fe *)psVar21);
      unaff_R14 = (secp256k1_ge *)local_2a8.y.n[2];
      if (0x20 < (int)(local_2e8.magnitude + local_34c)) goto LAB_0014e690;
      psVar25 = (secp256k1_ge *)0xffffefffffc2f;
      unaff_R13 = (secp256k1_ge *)0x1000003d1;
      local_2e8.n[0] = local_238 + local_2e8.n[0];
      local_2e8.n[1] = uStack_230 + local_2e8.n[1];
      local_2e8.n[2] = local_228 + local_2e8.n[2];
      local_2e8.n[3] = uStack_220 + local_2e8.n[3];
      local_2e8.n[4] = local_2e8.n[4] + local_2a8.y.n[3];
      local_2e8.normalized = 0;
      local_2e8.magnitude = local_2e8.magnitude + local_34c;
      psStack_360 = (secp256k1_fe *)0x14e36b;
      secp256k1_fe_verify(unaff_RBP);
      local_2a8.x.n[4] = local_138.y.n[4];
      local_2a8.x.magnitude = local_138.y.magnitude;
      local_2a8.x.normalized = local_138.y.normalized;
      local_2a8.x.n[2] = local_138.y.n[2];
      local_2a8.x.n[3] = local_138.y.n[3];
      local_2a8.x.n[0] = local_138.y.n[0];
      local_2a8.x.n[1] = local_138.y.n[1];
      unaff_R15 = &local_2a8;
      psStack_360 = (secp256k1_fe *)0x14e3a6;
      secp256k1_fe_verify(&unaff_R15->x);
      psVar21 = (secp256k1_ge *)(local_218 + 0x30);
      psStack_360 = (secp256k1_fe *)0x14e3b3;
      secp256k1_fe_verify((secp256k1_fe *)psVar21);
      uVar11 = uVar11 + local_2a8.x.magnitude;
      psVar12 = (secp256k1_ge *)(ulong)uVar11;
      psVar17 = unaff_R14;
      a = unaff_R15;
      if (0x20 < (int)uVar11) goto LAB_0014e695;
      local_2a8.x.n[0] = local_2a8.y.n[4] + local_2a8.x.n[0];
      local_2a8.x.n[1] = local_2a8.y._40_8_ + local_2a8.x.n[1];
      local_2a8.x.n[2] = local_2a8._96_8_ + local_2a8.x.n[2];
      local_2a8.x.n[3] = uStack_240 + local_2a8.x.n[3];
      local_2a8.x.n[4] = (long)(unaff_R14->x).n + local_2a8.x.n[4];
      local_2a8.x.normalized = 0;
      local_2a8.x.magnitude = uVar11;
      psStack_360 = (secp256k1_fe *)0x14e41b;
      secp256k1_fe_verify(&unaff_R15->x);
      psStack_360 = (secp256k1_fe *)0x14e423;
      secp256k1_fe_verify(unaff_RBP);
      uVar19 = (local_2e8.n[4] >> 0x30) * 0x1000003d1 + local_2e8.n[0];
      if (((uVar19 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar19 & 0xfffffffffffff) == 0)) {
        uVar9 = (uVar19 >> 0x34) + local_2e8.n[1];
        uVar16 = (uVar9 >> 0x34) + local_2e8.n[2];
        uVar20 = (uVar16 >> 0x34) + local_2e8.n[3];
        uVar24 = (uVar20 >> 0x34) + (local_2e8.n[4] & 0xffffffffffff);
        if ((((uVar9 | uVar19 | uVar16 | uVar20) & 0xfffffffffffff) != 0 || uVar24 != 0) &&
           ((uVar19 + 0x1000003d0 & uVar9 & uVar16 & uVar20 & (uVar24 ^ 0xf000000000000)) !=
            0xfffffffffffff)) goto LAB_0014e5c3;
        psStack_360 = (secp256k1_fe *)0x14e4f2;
        secp256k1_fe_verify(&unaff_R15->x);
        uVar19 = (local_2a8.x.n[4] >> 0x30) * 0x1000003d1 + local_2a8.x.n[0];
        if (((uVar19 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar19 & 0xfffffffffffff) != 0))
        goto LAB_0014e5c3;
        uVar9 = (uVar19 >> 0x34) + local_2a8.x.n[1];
        pre_g = (secp256k1_ge_storage *)((uVar9 >> 0x34) + local_2a8.x.n[2]);
        psVar21 = (secp256k1_ge *)(((ulong)pre_g >> 0x34) + local_2a8.x.n[3]);
        uVar16 = ((ulong)psVar21 >> 0x34) + (local_2a8.x.n[4] & 0xffffffffffff);
        if ((((uVar9 | uVar19 | (ulong)pre_g | (ulong)psVar21) & 0xfffffffffffff) != 0 ||
             uVar16 != 0) &&
           ((uVar19 + 0x1000003d0 & uVar9 & (ulong)pre_g & (ulong)psVar21 &
            (uVar16 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_0014e5c3;
        goto LAB_0014e6a9;
      }
LAB_0014e5c3:
      a = (secp256k1_ge *)(local_348 + 0x30);
      unaff_RBP = &local_2e8;
      psStack_360 = (secp256k1_fe *)0x14e5db;
      iVar4 = secp256k1_fe_equal((secp256k1_fe *)a,unaff_RBP);
      unaff_R13 = (secp256k1_ge *)local_348;
      if (iVar4 != 0) {
        psStack_360 = (secp256k1_fe *)0x14e5ef;
        pre_g = (secp256k1_ge_storage *)unaff_R15;
        psVar21 = unaff_R13;
        iVar4 = secp256k1_fe_equal((secp256k1_fe *)unaff_R13,&unaff_R15->x);
        if (iVar4 == 0) goto LAB_0014e5f7;
        goto LAB_0014e69f;
      }
LAB_0014e5f7:
      psStack_360 = (secp256k1_fe *)0x14e605;
      secp256k1_fe_mul((secp256k1_fe *)a,(secp256k1_fe *)a,&unaff_R15->x);
      psStack_360 = (secp256k1_fe *)0x14e613;
      secp256k1_fe_mul((secp256k1_fe *)unaff_R13,(secp256k1_fe *)unaff_R13,unaff_RBP);
      psStack_360 = (secp256k1_fe *)0x14e61e;
      pre_g = (secp256k1_ge_storage *)unaff_R13;
      psVar21 = a;
      iVar4 = secp256k1_fe_equal((secp256k1_fe *)a,(secp256k1_fe *)unaff_R13);
      if (iVar4 == 0) goto LAB_0014e69a;
      psVar12 = &local_138;
      psVar25 = &local_1a8;
      for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
        (psVar25->x).n[0] = (psVar12->x).n[0];
        psVar12 = (secp256k1_ge *)((long)psVar12 + ((ulong)bVar3 * -2 + 1) * 8);
        psVar25 = (secp256k1_ge *)((long)psVar25 + ((ulong)bVar3 * -2 + 1) * 8);
      }
      psVar12 = (secp256k1_ge *)((local_2b0->y).n + 2);
      if (psVar12 == (secp256k1_ge *)0x80000) {
        return;
      }
    }
    psStack_360 = (secp256k1_fe *)0x14e686;
    test_pre_g_table_cold_9();
    psVar25 = unaff_R12;
LAB_0014e686:
    psStack_360 = (secp256k1_fe *)0x14e68b;
    test_pre_g_table_cold_8();
LAB_0014e68b:
    psStack_360 = (secp256k1_fe *)0x14e690;
    test_pre_g_table_cold_7();
LAB_0014e690:
    psStack_360 = (secp256k1_fe *)0x14e695;
    test_pre_g_table_cold_6();
LAB_0014e695:
    unaff_R15 = psVar17;
    psStack_360 = (secp256k1_fe *)0x14e69a;
    test_pre_g_table_cold_5();
LAB_0014e69a:
    psStack_360 = (secp256k1_fe *)0x14e69f;
    test_pre_g_table_cold_4();
LAB_0014e69f:
    psStack_360 = (secp256k1_fe *)0x14e6a4;
    test_pre_g_table_cold_3();
    unaff_R14 = unaff_R15;
    unaff_R15 = a;
LAB_0014e6a4:
    psStack_360 = (secp256k1_fe *)0x14e6a9;
    test_pre_g_table_cold_1();
LAB_0014e6a9:
    psStack_360 = (secp256k1_fe *)0x14e6ae;
    test_pre_g_table_cold_2();
  }
  psStack_360 = (secp256k1_fe *)secp256k1_wnaf_fixed;
  test_pre_g_table_cold_10();
  pcStack_3b8 = (code *)0x14e6d2;
  psVar17 = (secp256k1_ge *)pre_g;
  psStack_388 = psVar12;
  psStack_380 = psVar25;
  psStack_378 = unaff_R13;
  psStack_370 = unaff_R14;
  psStack_368 = unaff_R15;
  psStack_360 = unaff_RBP;
  secp256k1_scalar_verify((secp256k1_scalar *)pre_g);
  auVar30._0_4_ =
       -(uint)((int)(((secp256k1_ge *)pre_g)->x).n[2] == 0 &&
              (int)(((secp256k1_ge *)pre_g)->x).n[0] == 0);
  auVar30._4_4_ =
       -(uint)(*(int *)((long)(((secp256k1_ge *)pre_g)->x).n + 0x14) == 0 &&
              *(int *)((long)(((secp256k1_ge *)pre_g)->x).n + 4) == 0);
  auVar30._8_4_ =
       -(uint)((int)(((secp256k1_ge *)pre_g)->x).n[3] == 0 &&
              (int)(((secp256k1_ge *)pre_g)->x).n[1] == 0);
  auVar30._12_4_ =
       -(uint)(*(int *)((long)(((secp256k1_ge *)pre_g)->x).n + 0x1c) == 0 &&
              *(int *)((long)(((secp256k1_ge *)pre_g)->x).n + 0xc) == 0);
  iVar4 = movmskps(extraout_EAX,auVar30);
  if (iVar4 == 0xf) {
    if (-1 < (int)(0x7f / (long)(int)extraout_EDX)) {
      pcStack_3b8 = (code *)0x14e7cc;
      memset(psVar21,0,(0x7f / (long)(int)extraout_EDX & 0xffffffffU) * 4 + 4);
    }
    return;
  }
  pcStack_3b8 = (code *)0x14e6ff;
  secp256k1_scalar_verify((secp256k1_scalar *)pre_g);
  uVar11 = (uint)(((secp256k1_ge *)pre_g)->x).n[0];
  pcStack_3b8 = (code *)0x14e70b;
  psVar12 = (secp256k1_ge *)pre_g;
  secp256k1_scalar_verify((secp256k1_scalar *)pre_g);
  if (0xffffffdf < extraout_EDX - 0x21) {
    uVar11 = ~uVar11 & 1;
    pcStack_3b8 = (code *)0x14e729;
    secp256k1_scalar_verify((secp256k1_scalar *)pre_g);
    bVar7 = (byte)extraout_EDX;
    *(uint *)(psVar21->x).n =
         ((uint)((int)(((secp256k1_ge *)pre_g)->x).n[extraout_EDX - 1 >> 6] << (-bVar7 & 0x1f)) >>
         (-bVar7 & 0x1f)) + uVar11;
    bVar3 = 0x7f / bVar7;
    uStack_390 = (ulong)bVar3;
    uVar13 = (uint)bVar3;
    uVar26 = 0x80 - bVar3 * extraout_EDX;
    uVar19 = uStack_390;
    uStack_3a4 = uVar11;
    psStack_398 = (secp256k1_ge *)pre_g;
    do {
      uVar11 = extraout_EDX;
      if (uVar19 == uStack_390) {
        uVar11 = uVar26;
      }
      pcStack_3b8 = (code *)0x14e784;
      uVar5 = secp256k1_scalar_get_bits_var
                        ((secp256k1_scalar *)psStack_398,(uint)uVar19 * extraout_EDX,uVar11);
      uVar11 = (uint)uVar19;
      if (uVar5 != 0) break;
      *(undefined4 *)((long)(psVar21->x).n + uVar19 * 4) = 0;
      uVar13 = uVar13 - 1;
      bVar29 = 1 < (long)uVar19;
      uVar19 = uVar19 - 1;
      uVar11 = uVar13;
    } while (bVar29);
    if ((int)uVar11 < 1) {
      return;
    }
    iStack_3a0 = -1 << (bVar7 & 0x1f);
    iStack_39c = 1 << (bVar7 & 0x1f);
    uVar19 = 1;
    uVar13 = extraout_EDX;
    do {
      count = extraout_EDX;
      if (uStack_390 == uVar19) {
        count = uVar26;
      }
      pcStack_3b8 = (code *)0x14e821;
      uVar5 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)psStack_398,uVar13,count);
      if ((uVar5 & 1) == 0) {
        piVar2 = (int *)((long)(psVar21->x).n + uVar19 * 4 + -4);
        *piVar2 = *piVar2 + iStack_3a0;
        uVar5 = uVar5 | 1;
      }
      *(uint32_t *)((long)(psVar21->x).n + uVar19 * 4) = uVar5;
      if (1 < uVar19) {
        iVar4 = *(int *)((long)(psVar21->x).n + uVar19 * 4 + -4);
        if (iVar4 == -1) {
          iVar4 = *(int *)((long)(psVar21->x).n + uVar19 * 4 + -8);
          if (0 < iVar4) {
            iVar4 = iVar4 + iStack_3a0;
            goto LAB_0014e866;
          }
        }
        else if ((iVar4 == 1) &&
                (iVar4 = *(int *)((long)(psVar21->x).n + uVar19 * 4 + -8), iVar4 < 0)) {
          iVar4 = iVar4 + iStack_39c;
LAB_0014e866:
          *(int *)((long)(psVar21->x).n + uVar19 * 4 + -8) = iVar4;
          *(undefined4 *)((long)(psVar21->x).n + uVar19 * 4 + -4) = 0;
        }
      }
      uVar19 = uVar19 + 1;
      uVar13 = uVar13 + extraout_EDX;
      if (uVar11 + 1 == uVar19) {
        return;
      }
    } while( true );
  }
  pcStack_3b8 = test_fixed_wnaf_small_helper;
  secp256k1_wnaf_fixed_cold_1();
  uVar19 = 0x20;
  do {
    uVar13 = (int)uVar19 - 1;
    uVar19 = (ulong)uVar13;
    if (*(int *)((long)(psVar12->x).n + uVar19 * 4) != 0) {
      pcStack_3c0 = (code *)0x14e8c7;
      test_fixed_wnaf_small_helper_cold_1();
      goto LAB_0014e8c7;
    }
  } while (8 < uVar13);
  uVar13 = 7;
  while (*(int *)((long)(psVar12->x).n + (ulong)uVar13 * 4) ==
         *(int *)((long)(psVar17->x).n + (ulong)uVar13 * 4)) {
    bVar29 = uVar13 == 0;
    uVar13 = uVar13 - 1;
    if (bVar29) {
      return;
    }
  }
LAB_0014e8c7:
  pcStack_3c0 = test_ecmult_target;
  test_fixed_wnaf_small_helper_cold_2();
  psVar23 = (secp256k1_gej *)auStack_fe0;
  psVar14 = (secp256k1_strauss_point_state *)((ulong)psVar17 & 0xffffffff);
  psVar27 = (secp256k1_scalar *)auStack_fc0;
  psStack_fe8 = (secp256k1_strauss_point_state *)0x14e8ef;
  psStack_3e8 = psVar21;
  psStack_3e0 = (secp256k1_ge *)pre_g;
  psStack_3d8 = unaff_R13;
  uStack_3d0 = (ulong)extraout_EDX;
  psStack_3c8 = unaff_R15;
  pcStack_3c0 = (code *)(ulong)uVar11;
  testutil_random_scalar_order_test(psVar27);
  psStack_fe8 = (secp256k1_strauss_point_state *)0x14e900;
  secp256k1_scalar_add((secp256k1_scalar *)auStack_fe0,psVar27,(secp256k1_scalar *)psVar12);
  psStack_fe8 = (secp256k1_strauss_point_state *)0x14e90b;
  secp256k1_scalar_negate((secp256k1_scalar *)auStack_fe0,(secp256k1_scalar *)auStack_fe0);
  if ((int)psVar17 == 0) {
    psStack_fe8 = (secp256k1_strauss_point_state *)0x14ea04;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_e58,(secp256k1_scalar *)auStack_fc0);
    psStack_fe8 = (secp256k1_strauss_point_state *)0x14ea1b;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_ef0,(secp256k1_scalar *)auStack_fe0);
    psStack_fe8 = (secp256k1_strauss_point_state *)0x14ea2f;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_f88,(secp256k1_scalar *)psVar12);
  }
  else {
    psStack_fe8 = (secp256k1_strauss_point_state *)0x14e923;
    testutil_random_ge_test(&sStack_dc0);
    psStack_fe8 = (secp256k1_strauss_point_state *)0x14e933;
    secp256k1_gej_set_ge(&sStack_d58,&sStack_dc0);
    if ((int)psVar17 == 1) {
      pre_g = (secp256k1_ge_storage *)asStack_cc0;
      unaff_R13 = asStack_b40;
      psVar14 = &sStack_800;
      psVar27 = &secp256k1_scalar_zero;
      psStack_fe8 = (secp256k1_strauss_point_state *)0x14e993;
      sStack_ef0.x.n[0] = (uint64_t)pre_g;
      sStack_ef0.x.n[1] = (uint64_t)unaff_R13;
      sStack_ef0.x.n[2] = (uint64_t)psVar14;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_ef0,&sStack_e58,1,&sStack_d58,
                 (secp256k1_scalar *)auStack_fc0,&secp256k1_scalar_zero);
      psStack_fe8 = (secp256k1_strauss_point_state *)0x14e9be;
      sStack_f88.x.n[0] = (uint64_t)pre_g;
      sStack_f88.x.n[1] = (uint64_t)unaff_R13;
      sStack_f88.x.n[2] = (uint64_t)psVar14;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_f88,&sStack_ef0,1,&sStack_d58,
                 (secp256k1_scalar *)auStack_fe0,&secp256k1_scalar_zero);
      psStack_fe8 = (secp256k1_strauss_point_state *)0x14e9e6;
      auStack_fc0._32_8_ = pre_g;
      psStack_f98 = unaff_R13;
      psStack_f90 = psVar14;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)(auStack_fc0 + 0x20),&sStack_f88,1,&sStack_d58,
                 (secp256k1_scalar *)psVar12,&secp256k1_scalar_zero);
      psVar23 = &sStack_d58;
    }
    else {
      psVar27 = (secp256k1_scalar *)&sStack_dc0;
      psStack_fe8 = (secp256k1_strauss_point_state *)0x14ea4e;
      secp256k1_ecmult_const(&sStack_e58,(secp256k1_ge *)psVar27,(secp256k1_scalar *)auStack_fc0);
      psStack_fe8 = (secp256k1_strauss_point_state *)0x14ea61;
      secp256k1_ecmult_const(&sStack_ef0,(secp256k1_ge *)psVar27,(secp256k1_scalar *)auStack_fe0);
      psStack_fe8 = (secp256k1_strauss_point_state *)0x14ea71;
      secp256k1_ecmult_const(&sStack_f88,(secp256k1_ge *)psVar27,(secp256k1_scalar *)psVar12);
      psVar23 = (secp256k1_gej *)auStack_fe0;
    }
  }
  psStack_fe8 = (secp256k1_strauss_point_state *)0x14ea8b;
  secp256k1_gej_add_var(&sStack_f88,&sStack_f88,&sStack_e58,(secp256k1_fe *)0x0);
  psStack_fe8 = (secp256k1_strauss_point_state *)0x14eaa0;
  psVar18 = &sStack_f88;
  secp256k1_gej_add_var(&sStack_f88,&sStack_f88,&sStack_ef0,(secp256k1_fe *)0x0);
  psStack_fe8 = (secp256k1_strauss_point_state *)0x14eaa8;
  psVar22 = &sStack_f88;
  secp256k1_gej_verify(&sStack_f88);
  if (sStack_f88.infinity != 0) {
    return;
  }
  psStack_fe8 = (secp256k1_strauss_point_state *)test_ecmult_constants_sha;
  test_ecmult_target_cold_1();
  out32 = (uchar *)((ulong)psVar22 & 0xffffffff);
  pcStack_1150 = (code *)0x14eaf6;
  psStack_1138 = psVar18;
  lStack_1130 = extraout_RDX;
  psStack_1010 = &sStack_f88;
  psStack_1008 = (secp256k1_ge *)pre_g;
  psStack_1000 = unaff_R13;
  psStack_ff8 = (secp256k1_ge *)psVar27;
  psStack_ff0 = psVar23;
  psStack_fe8 = psVar14;
  scratch = secp256k1_scratch_space_create(CTX,0x10000);
  uStack_113e = SUB84(psVar22,0);
  psVar28 = &sStack_1078;
  sStack_1078.s[0] = 0x6a09e667;
  sStack_1078.s[1] = 0xbb67ae85;
  sStack_1078.s[2] = 0x3c6ef372;
  sStack_1078.s[3] = 0xa54ff53a;
  sStack_1078.s[4] = 0x510e527f;
  sStack_1078.s[5] = 0x9b05688c;
  sStack_1078.s[6] = 0x1f83d9ab;
  sStack_1078.s[7] = 0x5be0cd19;
  psVar18 = (secp256k1_gej *)0x0;
  sStack_1078.bytes = 0;
  psVar27 = (secp256k1_scalar *)(auStack_1128 + 0x20);
  auStack_1128._32_8_ = 0;
  uStack_1100._0_4_ = 0;
  uStack_1100._4_4_ = 0;
  uStack_10f8 = 0;
  uStack_10f0 = 0;
  pcStack_1150 = (code *)0x14eb40;
  secp256k1_scalar_verify(psVar27);
  pcStack_1150 = (code *)0x14eb4e;
  test_ecmult_accumulate(psVar28,psVar27,scratch);
  auStack_1128._32_8_ = 1;
  uStack_1100._0_4_ = 0;
  uStack_1100._4_4_ = 0;
  uStack_10f8 = 0;
  uStack_10f0 = 0;
  pcStack_1150 = (code *)0x14eb6a;
  secp256k1_scalar_verify(psVar27);
  pcStack_1150 = (code *)0x14eb78;
  test_ecmult_accumulate(psVar28,psVar27,scratch);
  pcStack_1150 = (code *)0x14eb83;
  secp256k1_scalar_negate(psVar27,psVar27);
  pcStack_1150 = (code *)0x14eb94;
  test_ecmult_accumulate(psVar28,psVar27,scratch);
  psVar23 = psStack_1138;
  if (psStack_1138 != (secp256k1_gej *)0x0) {
    psVar18 = (secp256k1_gej *)0x0;
    psVar28 = &sStack_10e8;
    out32 = auStack_1128;
    do {
      uStack_113a = SUB82(psVar18,0);
      sStack_10e8.s[0] = 0x6a09e667;
      sStack_10e8.s[1] = 0xbb67ae85;
      sStack_10e8.s[2] = 0x3c6ef372;
      sStack_10e8.s[3] = 0xa54ff53a;
      sStack_10e8.s[4] = 0x510e527f;
      sStack_10e8.s[5] = 0x9b05688c;
      sStack_10e8.s[6] = 0x1f83d9ab;
      sStack_10e8.s[7] = 0x5be0cd19;
      sStack_10e8.bytes = 0;
      pcStack_1150 = (code *)0x14ebf0;
      secp256k1_sha256_write(psVar28,(uchar *)&uStack_113e,6);
      pcStack_1150 = (code *)0x14ebfb;
      secp256k1_sha256_finalize(psVar28,out32);
      pcStack_1150 = (code *)0x14ec08;
      secp256k1_scalar_set_b32((secp256k1_scalar *)(auStack_1128 + 0x20),out32,(int *)0x0);
      pcStack_1150 = (code *)0x14ec1b;
      test_ecmult_accumulate(&sStack_1078,(secp256k1_scalar *)(auStack_1128 + 0x20),scratch);
      psVar18 = (secp256k1_gej *)((long)(psVar18->x).n + 1);
    } while (psVar23 != psVar18);
  }
  hash = &sStack_1078;
  psVar12 = (secp256k1_ge *)auStack_1128;
  pcStack_1150 = (code *)0x14ec35;
  secp256k1_sha256_finalize(hash,(uchar *)psVar12);
  lVar8 = 0;
  while (auStack_1128[lVar8] == *(char *)(lStack_1130 + lVar8)) {
    lVar8 = lVar8 + 1;
    if (lVar8 == 0x20) {
      pcStack_1150 = (code *)0x14ec5d;
      secp256k1_scratch_space_destroy(CTX,scratch);
      return;
    }
  }
  pcStack_1150 = test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  psStack_1158 = psVar23;
  auStack_1e00 = (undefined1  [8])0x41;
  psStack_1e18 = (secp256k1_scalar *)0x14ecad;
  psStack_1178 = scratch;
  psStack_1170 = psVar28;
  puStack_1168 = auStack_1128 + 0x20;
  psStack_1160 = psVar18;
  pcStack_1150 = (code *)out32;
  secp256k1_gej_set_ge(&sStack_1c18,&secp256k1_ge_const_g);
  psStack_1e18 = (secp256k1_scalar *)0x14ecba;
  secp256k1_gej_set_infinity(&sStack_1cb0);
  psStack_1e18 = (secp256k1_scalar *)0x14ecd1;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_1b80 + 1,(secp256k1_scalar *)psVar12);
  psVar14 = (secp256k1_strauss_point_state *)(asStack_18d0[5].y.n + 3);
  psStack_1e18 = (secp256k1_scalar *)0x14ed23;
  sStack_1d48.x.n[0] = (uint64_t)asStack_1a50;
  sStack_1d48.x.n[1] = (uint64_t)asStack_18d0;
  sStack_1d48.x.n[2] = (uint64_t)psVar14;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1d48,&sStack_1b80,1,&sStack_1c18,
             (secp256k1_scalar *)psVar12,&secp256k1_scalar_zero);
  psStack_1e18 = (secp256k1_scalar *)0x14ed53;
  auStack_1df8._0_8_ = asStack_1a50;
  auStack_1df8._8_8_ = asStack_18d0;
  auStack_1df8._16_8_ = psVar14;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)auStack_1df8,&sStack_1d48,1,&sStack_1cb0,
             &secp256k1_scalar_zero,(secp256k1_scalar *)psVar12);
  error_callback = (secp256k1_callback *)0xd0;
  psVar23 = (secp256k1_gej *)&CTX->error_callback;
  cb = (secp256k1_ecmult_multi_callback *)0x0;
  psVar21 = (secp256k1_ge *)0x0;
  psStack_1e18 = (secp256k1_scalar *)0x14ed84;
  psVar27 = (secp256k1_scalar *)psVar12;
  psVar25 = scratch_00;
  iVar4 = secp256k1_ecmult_multi_var
                    ((secp256k1_callback *)psVar23,(secp256k1_scratch *)scratch_00,
                     (secp256k1_gej *)(asStack_18d0[5].y.n + 3),(secp256k1_scalar *)psVar12,
                     (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  if (iVar4 == 0) {
    psStack_1e18 = (secp256k1_scalar *)0x14eee9;
    test_ecmult_accumulate_cold_8();
LAB_0014eee9:
    psStack_1e18 = (secp256k1_scalar *)0x14eeee;
    test_ecmult_accumulate_cold_7();
LAB_0014eeee:
    psStack_1e18 = (secp256k1_scalar *)0x14eef3;
    test_ecmult_accumulate_cold_6();
LAB_0014eef3:
    psStack_1e18 = (secp256k1_scalar *)0x14eef8;
    test_ecmult_accumulate_cold_5();
LAB_0014eef8:
    psStack_1e18 = (secp256k1_scalar *)0x14eefd;
    test_ecmult_accumulate_cold_4();
LAB_0014eefd:
    psStack_1e18 = (secp256k1_scalar *)0x14ef02;
    test_ecmult_accumulate_cold_3();
LAB_0014ef02:
    psStack_1e18 = (secp256k1_scalar *)0x14ef07;
    test_ecmult_accumulate_cold_2();
  }
  else {
    error_callback = &CTX->error_callback;
    psVar27 = &secp256k1_scalar_zero;
    cb = test_ecmult_accumulate_cb;
    psStack_1e18 = (secp256k1_scalar *)0x14edbf;
    psVar25 = scratch_00;
    psVar23 = (secp256k1_gej *)error_callback;
    psVar21 = psVar12;
    iVar4 = secp256k1_ecmult_multi_var
                      (error_callback,(secp256k1_scratch *)scratch_00,asStack_18d0,
                       &secp256k1_scalar_zero,test_ecmult_accumulate_cb,psVar12,1);
    if (iVar4 == 0) goto LAB_0014eee9;
    psStack_1e18 = (secp256k1_scalar *)0x14edde;
    secp256k1_ecmult_const(asStack_1a50,&secp256k1_ge_const_g,(secp256k1_scalar *)psVar12);
    psVar12 = (secp256k1_ge *)auStack_1df8;
    psStack_1e18 = (secp256k1_scalar *)0x14edf3;
    secp256k1_ge_set_gej_var(psVar12,&sStack_1b80 + 1);
    psVar23 = &sStack_1b80;
    psStack_1e18 = (secp256k1_scalar *)0x14ee03;
    psVar25 = psVar12;
    iVar4 = secp256k1_gej_eq_ge_var(psVar23,psVar12);
    if (iVar4 == 0) goto LAB_0014eeee;
    psVar23 = &sStack_1d48;
    psVar25 = (secp256k1_ge *)auStack_1df8;
    psStack_1e18 = (secp256k1_scalar *)0x14ee1d;
    iVar4 = secp256k1_gej_eq_ge_var(psVar23,psVar25);
    if (iVar4 == 0) goto LAB_0014eef3;
    psVar23 = (secp256k1_gej *)(asStack_18d0[5].y.n + 3);
    psVar25 = (secp256k1_ge *)auStack_1df8;
    psStack_1e18 = (secp256k1_scalar *)0x14ee37;
    iVar4 = secp256k1_gej_eq_ge_var(psVar23,psVar25);
    if (iVar4 == 0) goto LAB_0014eef8;
    psVar23 = asStack_18d0;
    psVar25 = (secp256k1_ge *)auStack_1df8;
    psStack_1e18 = (secp256k1_scalar *)0x14ee51;
    iVar4 = secp256k1_gej_eq_ge_var(psVar23,psVar25);
    if (iVar4 == 0) goto LAB_0014eefd;
    psVar23 = asStack_1a50;
    psVar25 = (secp256k1_ge *)auStack_1df8;
    psStack_1e18 = (secp256k1_scalar *)0x14ee6b;
    iVar4 = secp256k1_gej_eq_ge_var(psVar23,psVar25);
    if (iVar4 == 0) goto LAB_0014ef02;
    psStack_1e18 = (secp256k1_scalar *)0x14ee80;
    secp256k1_ge_verify((secp256k1_ge *)auStack_1df8);
    if (auStack_1df8._96_4_ != 0) {
      auStack_1df8[0x68] = 0;
      sVar10 = 1;
LAB_0014eec8:
      psStack_1e18 = (secp256k1_scalar *)0x14eed2;
      secp256k1_sha256_write(hash,auStack_1df8 + 0x68,sVar10);
      return;
    }
    psVar23 = (secp256k1_gej *)auStack_1df8;
    psVar25 = (secp256k1_ge *)(auStack_1df8 + 0x68);
    psVar12 = (secp256k1_ge *)auStack_1e00;
    psVar27 = (secp256k1_scalar *)0x0;
    psStack_1e18 = (secp256k1_scalar *)0x14eeb5;
    secp256k1_eckey_pubkey_serialize((secp256k1_ge *)psVar23,(uchar *)psVar25,(size_t *)psVar12,0);
    if (auStack_1e00 == (undefined1  [8])0x41) {
      sVar10 = 0x41;
      goto LAB_0014eec8;
    }
  }
  psStack_1e18 = (secp256k1_scalar *)secp256k1_ecmult_multi_var;
  test_ecmult_accumulate_cold_1();
  psStack_1e18 = &secp256k1_scalar_zero;
  psStack_1e40 = asStack_1a50;
  psStack_1e38 = error_callback;
  psStack_1e28 = psVar12;
  psStack_1e20 = psVar14;
  secp256k1_gej_set_infinity(r);
  if ((secp256k1_ge *)psVar27 != (secp256k1_ge *)0x0 || hash != (secp256k1_sha256 *)0x0) {
    if (hash == (secp256k1_sha256 *)0x0) {
      sStack_2730.aux = asStack_2308;
      sStack_2730.pre_a = asStack_2188;
      sStack_2730.ps = &sStack_2718;
      secp256k1_ecmult_strauss_wnaf(&sStack_2730,r,1,r,&secp256k1_scalar_zero,psVar27);
    }
    else {
      if ((psVar25 == (secp256k1_ge *)0x0) ||
         (sVar10 = secp256k1_pippenger_max_points
                             ((secp256k1_callback *)psVar23,(secp256k1_scratch *)psVar25),
         sVar10 == 0)) {
LAB_0014f136:
        secp256k1_ecmult_multi_simple_var(r,psVar27,cb,psVar21,(size_t)hash);
        return;
      }
      uVar19 = 5000000;
      if (sVar10 < 5000000) {
        uVar19 = sVar10;
      }
      puVar1 = (undefined1 *)((long)&hash[-1].bytes + 7);
      uStack_2738 = (ulong)puVar1 / uVar19 + 1;
      uVar19 = (ulong)puVar1 / uStack_2738;
      if (uVar19 < 0x57) {
        lVar8 = 0;
        do {
          if (*(char *)((long)(psVar25->x).n + lVar8) != "scratch"[lVar8]) {
            (*(code *)(psVar23->x).n[0])("invalid scratch space",(psVar23->x).n[1]);
            goto LAB_0014f136;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
        uVar9 = (psVar25->x).n[3] - (psVar25->x).n[2];
        uVar19 = 0;
        if (0x4a < uVar9) {
          uVar19 = uVar9 - 0x4b;
        }
        if (uVar19 < 0x988) goto LAB_0014f136;
        uVar19 = uVar19 / 0x988;
        if (4999999 < uVar19) {
          uVar19 = 5000000;
        }
        uStack_2738 = (ulong)puVar1 / uVar19 + 1;
        uVar19 = (ulong)puVar1 / uStack_2738;
        pcVar6 = secp256k1_ecmult_strauss_batch;
      }
      else {
        pcVar6 = secp256k1_ecmult_pippenger_batch;
      }
      psVar28 = (secp256k1_sha256 *)(uVar19 + 1);
      lVar8 = 0;
      uVar19 = 0;
      do {
        psVar15 = psVar28;
        if (hash < psVar28) {
          psVar15 = hash;
        }
        psVar12 = (secp256k1_ge *)0x0;
        if (uVar19 == 0) {
          psVar12 = (secp256k1_ge *)psVar27;
        }
        iVar4 = (*pcVar6)(psVar23,psVar25,&sStack_2718,psVar12,cb,psVar21,psVar15,lVar8);
        if (iVar4 == 0) {
          return;
        }
        secp256k1_gej_add_var(r,r,(secp256k1_gej *)&sStack_2718,(secp256k1_fe *)0x0);
        hash = (secp256k1_sha256 *)((long)hash - (long)psVar15);
        uVar19 = uVar19 + 1;
        lVar8 = (long)psVar28->s + lVar8;
      } while (uStack_2738 != uVar19);
    }
  }
  return;
}

Assistant:

static void test_pre_g_table(const secp256k1_ge_storage * pre_g, size_t n) {
    /* Tests the pre_g / pre_g_128 tables for consistency.
     * For independent verification we take a "geometric" approach to verification.
     * We check that every entry is on-curve.
     * We check that for consecutive entries p and q, that p + gg - q = 0 by checking
     *  (1) p, gg, and -q are colinear.
     *  (2) p, gg, and -q are all distinct.
     * where gg is twice the generator, where the generator is the first table entry.
     *
     * Checking the table's generators are correct is done in run_ecmult_pre_g.
     */
    secp256k1_gej g2;
    secp256k1_ge p, q, gg;
    secp256k1_fe dpx, dpy, dqx, dqy;
    size_t i;

    CHECK(0 < n);

    secp256k1_ge_from_storage(&p, &pre_g[0]);
    CHECK(secp256k1_ge_is_valid_var(&p));

    secp256k1_gej_set_ge(&g2, &p);
    secp256k1_gej_double_var(&g2, &g2, NULL);
    secp256k1_ge_set_gej_var(&gg, &g2);
    for (i = 1; i < n; ++i) {
        secp256k1_fe_negate(&dpx, &p.x, 1); secp256k1_fe_add(&dpx, &gg.x); secp256k1_fe_normalize_weak(&dpx);
        secp256k1_fe_negate(&dpy, &p.y, 1); secp256k1_fe_add(&dpy, &gg.y); secp256k1_fe_normalize_weak(&dpy);
        /* Check that p is not equal to gg */
        CHECK(!secp256k1_fe_normalizes_to_zero_var(&dpx) || !secp256k1_fe_normalizes_to_zero_var(&dpy));

        secp256k1_ge_from_storage(&q, &pre_g[i]);
        CHECK(secp256k1_ge_is_valid_var(&q));

        secp256k1_fe_negate(&dqx, &q.x, 1); secp256k1_fe_add(&dqx, &gg.x);
        dqy = q.y; secp256k1_fe_add(&dqy, &gg.y);
        /* Check that -q is not equal to gg */
        CHECK(!secp256k1_fe_normalizes_to_zero_var(&dqx) || !secp256k1_fe_normalizes_to_zero_var(&dqy));

        /* Check that -q is not equal to p */
        CHECK(!secp256k1_fe_equal(&dpx, &dqx) || !secp256k1_fe_equal(&dpy, &dqy));

        /* Check that p, -q and gg are colinear */
        secp256k1_fe_mul(&dpx, &dpx, &dqy);
        secp256k1_fe_mul(&dpy, &dpy, &dqx);
        CHECK(secp256k1_fe_equal(&dpx, &dpy));

        p = q;
    }
}